

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

bool __thiscall GlobOpt::HasMemOp(GlobOpt *this,Loop *loop)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  byte local_19;
  Loop *loop_local;
  GlobOpt *this_local;
  
  local_19 = 0;
  if ((loop != (Loop *)0x0) && (local_19 = 0, (*(ushort *)&loop->field_0x178 >> 10 & 1) != 0)) {
    uVar2 = Func::GetSourceContextId(this->func);
    uVar3 = Func::GetLocalFunctionId(this->func);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,MemSetPhase,uVar2,uVar3);
    if (bVar1) {
      uVar2 = Func::GetSourceContextId(this->func);
      uVar3 = Func::GetLocalFunctionId(this->func);
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,MemCopyPhase,uVar2,uVar3);
      local_19 = 0;
      if (bVar1) goto LAB_005ff962;
    }
    local_19 = 0;
    if ((loop->memOpInfo != (MemOpInfo *)0x0) &&
       (local_19 = 0, loop->memOpInfo->candidates != (MemOpList *)0x0)) {
      bVar1 = SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Empty
                        ((SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
                         loop->memOpInfo->candidates);
      local_19 = bVar1 ^ 0xff;
    }
  }
LAB_005ff962:
  return (bool)(local_19 & 1);
}

Assistant:

bool GlobOpt::HasMemOp(Loop *loop)
{
#pragma prefast(suppress: 6285, "logical-or of constants is by design")
    return (
        loop &&
        loop->doMemOp &&
        (
            !PHASE_OFF(Js::MemSetPhase, this->func) ||
            !PHASE_OFF(Js::MemCopyPhase, this->func)
        ) &&
        loop->memOpInfo &&
        loop->memOpInfo->candidates &&
        !loop->memOpInfo->candidates->Empty()
    );
}